

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O1

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  If_Cut_t *pCut;
  float *pfVar1;
  float fVar2;
  char cVar3;
  short sVar4;
  If_Par_t *pIVar5;
  If_Obj_t *pIVar6;
  If_Cut_t *pC;
  Vec_Mem_t *pVVar7;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var8;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var9;
  Vec_Str_t *pVVar10;
  int *piVar11;
  If_Man_t *pIVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  If_Man_t *pCutSet;
  char *pcVar17;
  If_Set_t *pIVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  undefined1 *puVar23;
  If_Man_t **ppIVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  word *pwVar28;
  long lVar29;
  long lVar30;
  If_Cut_t *pIVar31;
  size_t __size;
  If_Man_t **ppIVar32;
  undefined1 *puVar33;
  uint uVar34;
  uint uVar35;
  If_Cut_t *pIVar36;
  word *pwVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  If_Man_t *pIVar43;
  If_Man_t *pIVar44;
  If_Cut_t *pIVar45;
  uint uVar46;
  ulong uVar47;
  ulong *puVar48;
  ulong *puVar49;
  ulong uVar50;
  If_Cut_t *pCut1;
  int iVar51;
  If_Cut_t *pCut0;
  float fVar52;
  word *pLimit;
  word *tLimit_1;
  word *tLimit;
  timespec ts;
  long local_8d0;
  uint local_89c;
  undefined1 local_838 [1024];
  If_Man_t *local_438 [129];
  
  pIVar5 = p->pPars;
  local_89c = 1;
  if ((((((pIVar5->fDelayOpt == 0) && (pIVar5->fDelayOptLut == 0)) && (pIVar5->fDsdBalance == 0)) &&
       ((pIVar5->fUserRecLib == 0 && (pIVar5->fUseDsdTune == 0)))) && (pIVar5->fUseCofVars == 0)) &&
     ((pIVar5->fUseAndVars == 0 && (pIVar5->fUse34Spec == 0)))) {
    local_89c = (uint)(pIVar5->pLutStruct != (char *)0x0);
  }
  bVar13 = true;
  if (pIVar5->nAndDelay < 1) {
    bVar13 = 0 < pIVar5->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x68,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x69,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 1) {
    fVar52 = (pObj->EstRefs + pObj->EstRefs + (float)pObj->nRefs) / 3.0;
LAB_0039950b:
    pObj->EstRefs = fVar52;
  }
  else if (Mode == 0) {
    fVar52 = (float)pObj->nRefs;
    goto LAB_0039950b;
  }
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    If_CutAreaDeref(p,&pObj->CutBest);
  }
  pIVar43 = p;
  pCutSet = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pCut = &pObj->CutBest;
  if (fFirst != 0) goto LAB_003996bb;
  pIVar5 = p->pPars;
  if (pIVar5->fDelayOpt == 0) {
    if (pIVar5->fDsdBalance != 0) {
      pIVar43 = p;
      iVar14 = If_CutDsdBalanceEval(p,pCut,(Vec_Int_t *)0x0);
      iVar15 = (int)pIVar43;
      goto LAB_003995b8;
    }
    if (pIVar5->fUserRecLib != 0) {
      pIVar43 = p;
      iVar14 = If_CutDelayRecCost3(p,pCut,pObj);
      iVar15 = (int)pIVar43;
      goto LAB_003995b8;
    }
    if (pIVar5->fDelayOptLut != 0) {
      pIVar43 = p;
      iVar14 = If_CutLutBalanceEval(p,pCut);
      iVar15 = (int)pIVar43;
      goto LAB_003995b8;
    }
    if (0 < pIVar5->nGateSize) {
      pIVar43 = p;
      iVar14 = If_CutDelaySop(p,pCut);
      iVar15 = (int)pIVar43;
      goto LAB_003995b8;
    }
    pIVar43 = p;
    fVar52 = If_CutDelay(p,pObj,pCut);
    iVar15 = (int)pIVar43;
  }
  else {
    pIVar43 = p;
    iVar14 = If_CutSopBalanceEval(p,pCut,(Vec_Int_t *)0x0);
    iVar15 = (int)pIVar43;
LAB_003995b8:
    fVar52 = (float)iVar14;
  }
  (pObj->CutBest).Delay = fVar52;
  if ((fVar52 == -1.0) && (!NAN(fVar52))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x88,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar2 = p->fEpsilon;
  if (fVar2 + fVar2 + pObj->Required < fVar52) {
    Abc_Print(iVar15,
              "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n"
              ,(double)fVar52,(double)(pObj->Required + fVar2),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    pIVar43 = p;
    fVar52 = If_CutAreaDerefed(p,pCut);
  }
  else {
    pIVar43 = p;
    fVar52 = If_CutAreaFlow(p,pCut);
  }
  pCut->Area = fVar52;
  if (p->pPars->fEdge != 0) {
    if (Mode == 2) {
      pIVar43 = p;
      fVar52 = If_CutEdgeDerefed(p,pCut);
    }
    else {
      pIVar43 = p;
      fVar52 = If_CutEdgeFlow(p,pCut);
    }
    (pObj->CutBest).Edge = fVar52;
  }
  if (p->pPars->fPower != 0) {
    if (Mode == 2) {
      pIVar43 = p;
      fVar52 = If_CutPowerDerefed(p,pCut,pObj);
    }
    else {
      pIVar43 = p;
      fVar52 = If_CutPowerFlow(p,pCut,pObj);
    }
    (pObj->CutBest).Power = fVar52;
  }
  if (fPreprocess == 0) {
    pIVar6 = pCutSet->pConst1;
    sVar4 = *(short *)((long)&pCutSet->pName + 2);
    *(short *)((long)&pCutSet->pName + 2) = sVar4 + 1;
    pIVar43 = *(If_Man_t **)(&pIVar6->field_0x0 + (long)sVar4 * 8);
    memcpy(pIVar43,pCut,(long)p->nCutBytes);
  }
LAB_003996bb:
  iVar14 = (int)pIVar43;
  pIVar18 = pObj->pFanin0->pCutSet;
  if (0 < pIVar18->nCuts) {
    lVar30 = 0;
    do {
      iVar14 = (int)pIVar43;
      pIVar45 = pIVar18->ppCuts[lVar30];
      if (pIVar45 == (If_Cut_t *)0x0) break;
      pIVar18 = pObj->pFanin1->pCutSet;
      if (0 < pIVar18->nCuts) {
        lVar29 = 0;
        do {
          pIVar31 = pIVar18->ppCuts[lVar29];
          if (pIVar31 == (If_Cut_t *)0x0) break;
          sVar4 = *(short *)((long)&pCutSet->pName + 2);
          if (*(short *)&pCutSet->pName < sVar4) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                          ,0x9c,
                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
          }
          uVar21 = pIVar31->uSign | pIVar45->uSign;
          uVar21 = (uVar21 >> 1 & 0x55555555) + (uVar21 & 0x55555555);
          uVar21 = (uVar21 >> 2 & 0x33333333) + (uVar21 & 0x33333333);
          uVar21 = (uVar21 >> 4 & 0x7070707) + (uVar21 & 0x7070707);
          uVar21 = (uVar21 >> 8 & 0xf000f) + (uVar21 & 0xf000f);
          pIVar43 = (If_Man_t *)p->pPars;
          if ((int)((uVar21 >> 0x10) + (uVar21 & 0xffff)) <= *(int *)&pIVar43->pName) {
            uVar26 = *(uint *)pObj >> 4 & 1 ^
                     *(uint *)&pIVar45->field_0x1c >> 0xc & 1 ^ pIVar45->iCutFunc;
            uVar21 = *(uint *)pObj >> 5 & 1 ^ pIVar31->iCutFunc ^
                     *(uint *)&pIVar31->field_0x1c >> 0xc & 1;
            iVar14 = *(int *)((long)pIVar43->puTemp + 0x1c);
            pCut1 = pIVar31;
            pCut0 = pIVar45;
            uVar35 = uVar26;
            if (((iVar14 != 0) &&
                (uVar34 = *(uint *)&pIVar45->field_0x1c >> 0x18,
                uVar46 = *(uint *)&pIVar31->field_0x1c >> 0x18, uVar34 <= uVar46)) &&
               ((uVar34 != uVar46 || ((int)uVar26 <= (int)uVar21)))) {
              pCut1 = pIVar45;
              pCut0 = pIVar31;
              uVar35 = uVar21;
              uVar21 = uVar26;
            }
            pC = *(If_Cut_t **)(&pCutSet->pConst1->field_0x0 + (long)sVar4 * 8);
            if (iVar14 == 0) {
              pIVar43 = p;
              iVar14 = If_CutMergeOrdered(p,pIVar45,pIVar31,pC);
            }
            else {
              pIVar43 = p;
              iVar14 = If_CutMerge(p,pCut0,pCut1,pC);
            }
            if ((iVar14 != 0) &&
               (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize))))
            {
              p->nCutsMerged = p->nCutsMerged + 1;
              p->nCutsTotal = p->nCutsTotal + 1;
              if ((p->pPars->fSkipCutFilter != 0) ||
                 (pIVar43 = pCutSet, iVar14 = If_CutFilter((If_Set_t *)pCutSet,pC,local_89c),
                 iVar14 == 0)) {
                uVar26 = 0;
                if (((bVar13) && (uVar26 = 0, pC->field_0x1f == '\x02')) &&
                   (pC[1].Area == (float)pObj->pFanin0->Id)) {
                  uVar26 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
                }
                pC->iCutFunc = -1;
                *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar26;
                if (p->pPars->fTruth != 0) {
                  if (p->pPars->fVerbose == 0) {
                    local_8d0 = 0;
                  }
                  else {
                    iVar14 = clock_gettime(3,(timespec *)local_838);
                    if (iVar14 < 0) {
                      local_8d0 = 1;
                    }
                    else {
                      lVar27 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_838._8_8_),
                                      8);
                      local_8d0 = ((lVar27 >> 7) - (lVar27 >> 0x3f)) + local_838._0_8_ * -1000000;
                    }
                  }
                  pIVar36 = pC;
                  if (p->pPars->fUseTtPerm == 0) {
                    pIVar43 = p;
                    iVar14 = If_CutComputeTruth(p,pC,pIVar45,pIVar31,*(uint *)pObj >> 4 & 1,
                                                *(uint *)pObj >> 5 & 1);
                  }
                  else {
                    pIVar43 = p;
                    iVar14 = If_CutComputeTruthPerm(p,pC,pCut0,pCut1,uVar35,uVar21);
                  }
                  if (p->pPars->fVerbose != 0) {
                    pIVar43 = (If_Man_t *)0x3;
                    pIVar36 = (If_Cut_t *)local_838;
                    iVar15 = clock_gettime(3,(timespec *)pIVar36);
                    if (iVar15 < 0) {
                      lVar27 = -1;
                    }
                    else {
                      lVar27 = (long)local_838._8_8_ / 1000 + local_838._0_8_ * 1000000;
                    }
                    p->timeCache[4] = p->timeCache[4] + lVar27 + local_8d0;
                  }
                  if ((p->pPars->fSkipCutFilter == 0) && (iVar14 != 0)) {
                    pIVar36 = pC;
                    pIVar43 = pCutSet;
                    iVar14 = If_CutFilter((If_Set_t *)pCutSet,pC,local_89c);
                    iVar15 = 7;
                    if (iVar14 == 0) goto LAB_00399a83;
                  }
                  else {
LAB_00399a83:
                    if (p->pPars->fUseDsd != 0) {
                      if (pC->iCutFunc < 0) goto LAB_0039af78;
                      uVar21 = (uint)pC->iCutFunc >> 1;
                      if ((p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar21) ||
                         (p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar21] == -1)) {
                        while( true ) {
                          bVar20 = pC->field_0x1f;
                          if ((int)uVar21 < p->vTtDsds[bVar20]->nSize) break;
                          Vec_IntPush(p->vTtDsds[bVar20],(int)pIVar36);
                          uVar35 = (uint)(byte)pC->field_0x1f;
                          uVar26 = 0;
                          do {
                            pVVar10 = p->vTtPerms[uVar35];
                            uVar35 = pVVar10->nCap;
                            if (pVVar10->nSize == uVar35) {
                              if ((int)uVar35 < 0x10) {
                                if (pVVar10->pArray == (char *)0x0) {
                                  pcVar17 = (char *)malloc(0x10);
                                }
                                else {
                                  pIVar36 = (If_Cut_t *)&DAT_00000010;
                                  pcVar17 = (char *)realloc(pVVar10->pArray,0x10);
                                }
                                pVVar10->pArray = pcVar17;
                                pIVar31 = (If_Cut_t *)&DAT_00000010;
                              }
                              else {
                                pIVar31 = (If_Cut_t *)((ulong)uVar35 * 2);
                                if ((int)pIVar31 <= (int)uVar35) goto LAB_00399b49;
                                if (pVVar10->pArray == (char *)0x0) {
                                  pcVar17 = (char *)malloc((size_t)pIVar31);
                                }
                                else {
                                  pIVar36 = pIVar31;
                                  pcVar17 = (char *)realloc(pVVar10->pArray,(size_t)pIVar31);
                                }
                                pVVar10->pArray = pcVar17;
                              }
                              pVVar10->nCap = (int)pIVar31;
                            }
LAB_00399b49:
                            iVar14 = pVVar10->nSize;
                            pVVar10->nSize = iVar14 + 1;
                            pVVar10->pArray[iVar14] = 'x';
                            uVar26 = uVar26 + 1;
                            uVar35 = *(uint *)&pC->field_0x1c >> 0x18;
                            uVar34 = 6;
                            if (6 < uVar35) {
                              uVar34 = uVar35;
                            }
                          } while (uVar26 < uVar34);
                        }
                        pVVar7 = p->vTtMem[bVar20];
                        if (pVVar7 == (Vec_Mem_t *)0x0) {
                          pwVar37 = (word *)0x0;
                        }
                        else {
                          if (pC->iCutFunc < 0) goto LAB_0039af78;
                          uVar35 = (uint)pC->iCutFunc >> 1;
                          if (pVVar7->nEntries <= (int)uVar35) goto LAB_0039afd5;
                          pwVar37 = pVVar7->ppPages[uVar35 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                    (ulong)(uVar35 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
                        }
                        if (pC->iCutFunc < 0) goto LAB_0039af78;
                        uVar35 = 6;
                        if (6 < bVar20) {
                          uVar35 = (uint)bVar20;
                        }
                        uVar35 = uVar35 * ((uint)pC->iCutFunc >> 1);
                        if (p->vTtPerms[bVar20]->nSize <= (int)uVar35) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                                        ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                        }
                        iVar14 = If_DsdManCompute(p->pIfDsdMan,pwVar37,(uint)bVar20,
                                                  (uchar *)(p->vTtPerms[bVar20]->pArray + uVar35),
                                                  p->pPars->pLutStruct);
                        if (p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar21)
                        goto LAB_0039b070;
                        p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar21] = iVar14;
                      }
                      uVar21 = pC->iCutFunc;
                      if ((int)uVar21 < 0) goto LAB_0039afb6;
                      uVar35 = p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar21 >> 1];
                      if ((int)uVar35 < 0) goto LAB_0039af97;
                      pIVar43 = (If_Man_t *)p->pIfDsdMan;
                      uVar35 = uVar35 ^ uVar21 & 1;
                      pIVar36 = (If_Cut_t *)(ulong)uVar35;
                      uVar21 = If_DsdManSuppSize((If_DsdMan_t *)pIVar43,uVar35);
                      if (uVar21 != (byte)pC->field_0x1f) {
                        __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0xe5,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                    }
                    uVar21 = *(uint *)&pC->field_0x1c;
                    *(uint *)&pC->field_0x1c = uVar21 & 0xffffbfff;
                    pIVar5 = p->pPars;
                    p_Var8 = pIVar5->pFuncCell;
                    if (p_Var8 == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) {
                      if (pIVar5->fUseDsdTune == 0) {
                        if (pIVar5->fUse34Spec == 0) {
                          if (pIVar5->fUseAndVars != 0) {
                            if (pC->iCutFunc < 0) goto LAB_0039af78;
                            if (0xd < pIVar5->nLutSize) {
                              __assert_fail("p->pPars->nLutSize <= 13",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                            ,0x121,
                                            "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                           );
                            }
                            uVar35 = (uint)pC->iCutFunc >> 1;
                            if ((p->vTtDecs[uVar21 >> 0x18]->nSize <= (int)uVar35) ||
                               (p->vTtDecs[uVar21 >> 0x18]->pArray[uVar35] == -1)) {
                              while( true ) {
                                uVar21 = *(uint *)&pC->field_0x1c;
                                uVar26 = uVar21 >> 0x18;
                                pIVar43 = (If_Man_t *)p->vTtDecs[uVar26];
                                if ((int)uVar35 < *(int *)((long)&pIVar43->pName + 4)) break;
                                Vec_IntPush((Vec_Int_t *)pIVar43,(int)pIVar36);
                              }
                              iVar14 = p->pPars->nLutSize;
                              iVar15 = iVar14 / 2;
                              uVar34 = 0;
                              if ((iVar15 < (int)uVar26) &&
                                 ((int)uVar26 <= (int)(iVar14 - (iVar14 >> 0x1f) & 0xfffffffeU))) {
                                pVVar7 = p->vTtMem[uVar26];
                                if (pVVar7 == (Vec_Mem_t *)0x0) {
                                  pwVar37 = (word *)0x0;
                                }
                                else {
                                  if (pC->iCutFunc < 0) goto LAB_0039af78;
                                  uVar34 = (uint)pC->iCutFunc >> 1;
                                  if (pVVar7->nEntries <= (int)uVar34) goto LAB_0039afd5;
                                  pwVar37 = pVVar7->ppPages
                                            [uVar34 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                            (ulong)(uVar34 & pVVar7->PageMask) *
                                            (long)pVVar7->nEntrySize;
                                }
                                uVar46 = 1 << ((char)(uVar21 >> 0x18) - 6U & 0x1f);
                                if (uVar21 < 0x7000000) {
                                  uVar46 = 1;
                                }
                                if (0 < (int)uVar46) {
                                  memcpy(local_838,pwVar37,(ulong)uVar46 << 3);
                                }
                                pIVar43 = (If_Man_t *)local_838;
                                uVar34 = Abc_TtProcessBiDecInt((word *)pIVar43,uVar26,iVar15);
                                if (uVar34 == 0) {
                                  if (0 < (int)uVar46) {
                                    uVar38 = 0;
                                    do {
                                      *(word *)(local_838 + uVar38 * 8) = ~pwVar37[uVar38];
                                      uVar38 = uVar38 + 1;
                                    } while (uVar46 != uVar38);
                                  }
                                  pIVar43 = (If_Man_t *)local_838;
                                  uVar21 = Abc_TtProcessBiDecInt((word *)pIVar43,uVar26,iVar15);
                                  uVar34 = uVar21 | 0x40000000;
                                  if (uVar21 == 0) {
                                    uVar34 = 0;
                                  }
                                }
                              }
                              if (p->vTtDecs[(byte)pC->field_0x1f]->nSize <= (int)uVar35) {
LAB_0039b070:
                                __assert_fail("i >= 0 && i < p->nSize",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)"
                                             );
                              }
                              p->vTtDecs[(byte)pC->field_0x1f]->pArray[uVar35] = uVar34;
                            }
                            uVar21 = *(uint *)&pC->field_0x1c >> 0x18;
                            if (p->vTtDecs[uVar21]->nSize <= (int)uVar35) {
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                            }
                            iVar14 = p->vTtDecs[uVar21]->pArray[uVar35];
                            if (iVar14 < 0) {
                              __assert_fail("iDecMask >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                            ,0x12d,
                                            "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                           );
                            }
                            uVar35 = 0;
                            if (iVar14 == 0) {
                              uVar35 = (uint)(p->pPars->nLutSize / 2 < (int)uVar21) << 0xe;
                            }
                            *(uint *)&pC->field_0x1c =
                                 *(uint *)&pC->field_0x1c & 0xffffbfff | uVar35;
                            p->nCutsUselessAll = p->nCutsUselessAll + (uVar35 >> 0xe);
                            p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                                 p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                                 (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                            p->nCutsCountAll = p->nCutsCountAll + 1;
                            p->nCutsCount[(byte)pC->field_0x1f] =
                                 p->nCutsCount[(byte)pC->field_0x1f] + 1;
                          }
                          if ((p->pPars->fUseCofVars != 0) &&
                             ((p->pPars->fUseAndVars == 0 || ((pC->field_0x1d & 0x40) != 0)))) {
                            if (pC->iCutFunc < 0) {
LAB_0039af78:
                              __assert_fail("Lit >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                            ,0x10c,"int Abc_Lit2Var(int)");
                            }
                            uVar21 = (uint)pC->iCutFunc >> 1;
                            if ((p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar21) ||
                               (p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar21] == -1)) {
                              uVar35 = *(uint *)&pC->field_0x1c;
                              uVar38 = (ulong)(uVar35 >> 0x18);
                              pVVar10 = p->vTtVars[uVar38];
                              uVar26 = pVVar10->nSize;
                              while ((int)uVar26 <= (int)uVar21) {
                                uVar35 = pVVar10->nCap;
                                if (uVar26 == uVar35) {
                                  if ((int)uVar35 < 0x10) {
                                    if (pVVar10->pArray == (char *)0x0) {
                                      pcVar17 = (char *)malloc(0x10);
                                    }
                                    else {
                                      pcVar17 = (char *)realloc(pVVar10->pArray,0x10);
                                    }
                                    pVVar10->pArray = pcVar17;
                                    __size = 0x10;
                                  }
                                  else {
                                    __size = (ulong)uVar35 * 2;
                                    if ((int)__size <= (int)uVar35) goto LAB_0039a771;
                                    if (pVVar10->pArray == (char *)0x0) {
                                      pcVar17 = (char *)malloc(__size);
                                    }
                                    else {
                                      pcVar17 = (char *)realloc(pVVar10->pArray,__size);
                                    }
                                    pVVar10->pArray = pcVar17;
                                  }
                                  pVVar10->nCap = (int)__size;
                                }
LAB_0039a771:
                                iVar14 = pVVar10->nSize;
                                pVVar10->nSize = iVar14 + 1;
                                pVVar10->pArray[iVar14] = -1;
                                uVar35 = *(uint *)&pC->field_0x1c;
                                uVar38 = (ulong)(uVar35 >> 0x18);
                                pVVar10 = p->vTtVars[uVar38];
                                uVar26 = pVVar10->nSize;
                              }
                              pIVar43 = (If_Man_t *)(ulong)uVar35;
                              pVVar7 = p->vTtMem[uVar38];
                              if (pVVar7 == (Vec_Mem_t *)0x0) {
                                puVar49 = (ulong *)0x0;
                              }
                              else {
                                if (pC->iCutFunc < 0) goto LAB_0039af78;
                                uVar26 = (uint)pC->iCutFunc >> 1;
                                if (pVVar7->nEntries <= (int)uVar26) goto LAB_0039afd5;
                                puVar49 = pVVar7->ppPages
                                          [uVar26 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                          (ulong)(uVar26 & pVVar7->PageMask) *
                                          (long)pVVar7->nEntrySize;
                              }
                              iVar14 = (int)uVar38;
                              iVar15 = iVar14 + -6;
                              uVar34 = 1 << ((byte)iVar15 & 0x1f);
                              uVar26 = uVar34;
                              if (uVar35 < 0x7000000) {
                                uVar26 = 1;
                              }
                              if (0xdffffff < uVar35) {
                                __assert_fail("nVars <= nVarsMax",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                              ,0x46b,"int Abc_TtCheckCondDep(word *, int, int)");
                              }
                              iVar22 = p->pPars->nLutSize / 2;
                              uVar47 = 0;
                              if ((iVar22 + 1 < iVar14) && (uVar47 = uVar38, 0xffffff < uVar35)) {
                                uVar46 = uVar34;
                                if ((int)uVar34 < 2) {
                                  uVar46 = 1;
                                }
                                uVar25 = 0;
LAB_0039a8b6:
                                bVar20 = (byte)uVar25;
                                if (uVar26 == 1) {
                                  pIVar43 = (If_Man_t *)
                                            ((s_Truths6Neg[uVar25] & *puVar49) <<
                                             ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) |
                                            s_Truths6Neg[uVar25] & *puVar49);
                                  local_838._0_8_ = pIVar43;
                                }
                                else if (uVar25 < 6) {
                                  if (0 < (int)uVar26) {
                                    uVar39 = s_Truths6Neg[uVar25];
                                    pIVar43 = (If_Man_t *)0x0;
                                    do {
                                      *(ulong *)(local_838 + (long)pIVar43 * 8) =
                                           (puVar49[(long)pIVar43] & uVar39) <<
                                           ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) |
                                           puVar49[(long)pIVar43] & uVar39;
                                      pIVar43 = (If_Man_t *)((long)&pIVar43->pName + 1);
                                    } while ((If_Man_t *)(ulong)uVar26 != pIVar43);
                                  }
                                }
                                else if (0 < (int)uVar26) {
                                  bVar19 = (byte)(uVar25 - 6);
                                  uVar40 = 1 << (bVar19 & 0x1f);
                                  lVar27 = (long)(2 << (bVar19 & 0x1f));
                                  uVar39 = 1;
                                  if (1 < (int)uVar40) {
                                    uVar39 = (ulong)uVar40;
                                  }
                                  pIVar43 = (If_Man_t *)(local_838 + (long)(int)uVar40 * 8);
                                  puVar33 = local_838;
                                  puVar48 = puVar49;
                                  do {
                                    if (uVar25 - 6 != 0x1f) {
                                      uVar50 = 0;
                                      do {
                                        piVar11 = (int *)puVar48[uVar50];
                                        *(int **)(puVar33 + uVar50 * 8) = piVar11;
                                        *(int **)((long)pIVar43->nObjs + (uVar50 - 8) * 8) = piVar11
                                        ;
                                        uVar50 = uVar50 + 1;
                                      } while (uVar39 != uVar50);
                                    }
                                    puVar48 = puVar48 + lVar27;
                                    pIVar43 = (If_Man_t *)((long)pIVar43->nObjs + (lVar27 + -8) * 8)
                                    ;
                                    puVar33 = puVar33 + lVar27 * 8;
                                  } while (puVar48 < puVar49 + (int)uVar26);
                                }
                                if (uVar26 == 1) {
                                  pIVar43 = (If_Man_t *)
                                            ((s_Truths6[uVar25] & *puVar49) >>
                                             ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) |
                                            s_Truths6[uVar25] & *puVar49);
                                  local_438[0] = pIVar43;
                                }
                                else if (uVar25 < 6) {
                                  if (0 < (int)uVar26) {
                                    uVar39 = s_Truths6[uVar25];
                                    pIVar43 = (If_Man_t *)0x0;
                                    do {
                                      local_438[(long)pIVar43] =
                                           (If_Man_t *)
                                           ((puVar49[(long)pIVar43] & uVar39) >>
                                            ((byte)(1 << (bVar20 & 0x1f)) & 0x3f) |
                                           puVar49[(long)pIVar43] & uVar39);
                                      pIVar43 = (If_Man_t *)((long)&pIVar43->pName + 1);
                                    } while ((If_Man_t *)(ulong)uVar26 != pIVar43);
                                  }
                                }
                                else if (0 < (int)uVar26) {
                                  bVar20 = (byte)(uVar25 - 6);
                                  uVar40 = 1 << (bVar20 & 0x1f);
                                  iVar16 = 2 << (bVar20 & 0x1f);
                                  pIVar43 = (If_Man_t *)0x1;
                                  if (1 < (int)uVar40) {
                                    pIVar43 = (If_Man_t *)(ulong)uVar40;
                                  }
                                  ppIVar32 = local_438;
                                  puVar48 = puVar49;
                                  do {
                                    if (uVar25 - 6 != 0x1f) {
                                      pIVar44 = (If_Man_t *)0x0;
                                      do {
                                        pIVar12 = (If_Man_t *)
                                                  puVar48[(long)pIVar44->nObjs +
                                                          (long)(int)uVar40 + -0x40];
                                        ppIVar32[(long)pIVar44] = pIVar12;
                                        ppIVar32[(long)pIVar44->nObjs + (long)(int)uVar40 + -0x40] =
                                             pIVar12;
                                        pIVar44 = (If_Man_t *)((long)&pIVar44->pName + 1);
                                      } while (pIVar43 != pIVar44);
                                    }
                                    puVar48 = puVar48 + iVar16;
                                    ppIVar32 = ppIVar32 + iVar16;
                                  } while (puVar48 < puVar49 + (int)uVar26);
                                }
                                uVar39 = 0;
                                iVar51 = 0;
                                iVar16 = 0;
LAB_0039aad7:
                                if (uVar25 != uVar39) {
                                  bVar20 = (byte)uVar39;
                                  if (uVar35 < 0x7000000) {
                                    uVar40 = 1 << (bVar20 & 0x1f);
                                    pIVar43 = (If_Man_t *)(ulong)uVar40;
                                    uVar40 = (uint)((s_Truths6Neg[uVar39] &
                                                    ((ulong)local_838._0_8_ >> ((byte)uVar40 & 0x3f)
                                                    ^ local_838._0_8_)) != 0);
                                  }
                                  else {
                                    uVar40 = 0;
                                    if (uVar39 < 6) {
                                      if (iVar15 != 0x1f) {
                                        uVar41 = 1 << (bVar20 & 0x1f);
                                        pIVar43 = (If_Man_t *)(ulong)uVar41;
                                        uVar50 = 0;
                                        do {
                                          if (((*(ulong *)(local_838 + uVar50 * 8) >>
                                                ((byte)uVar41 & 0x3f) ^
                                               *(ulong *)(local_838 + uVar50 * 8)) &
                                              s_Truths6Neg[uVar39]) != 0) goto LAB_0039abb3;
                                          uVar50 = uVar50 + 1;
                                          uVar40 = 0;
                                        } while (uVar46 != uVar50);
                                      }
                                    }
                                    else if (iVar15 != 0x1f) {
                                      pIVar43 = (If_Man_t *)(ulong)(uint)(1 << (bVar20 - 6 & 0x1f));
                                      uVar50 = (ulong)(uint)(2 << (bVar20 - 6 & 0x1f));
                                      puVar23 = local_838 + (long)pIVar43 * 8;
                                      puVar33 = local_838;
                                      do {
                                        pIVar44 = (If_Man_t *)0x0;
                                        do {
                                          if (*(long *)(puVar33 + (long)pIVar44 * 8) !=
                                              *(long *)(puVar23 + (long)pIVar44 * 8))
                                          goto LAB_0039abb3;
                                          pIVar44 = (If_Man_t *)((long)&pIVar44->pName + 1);
                                        } while (pIVar43 != pIVar44);
                                        puVar33 = puVar33 + uVar50 * 8;
                                        puVar23 = puVar23 + uVar50 * 8;
                                        uVar40 = 0;
                                      } while (puVar33 < local_838 + (long)(int)uVar34 * 8);
                                    }
                                  }
                                  goto LAB_0039abc1;
                                }
                                goto LAB_0039acbc;
                              }
LAB_0039ad00:
                              if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar21) {
                                __assert_fail("i >= 0 && i < p->nSize",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                                              ,0x186,
                                              "void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
                              }
                              p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar21] = (char)uVar47;
                            }
                            uVar35 = *(uint *)&pC->field_0x1c;
                            uVar26 = uVar35 >> 0x18;
                            if (p->vTtVars[uVar26]->nSize <= (int)uVar21) {
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                            }
                            cVar3 = p->vTtVars[uVar26]->pArray[uVar21];
                            if ((cVar3 < '\0') || ((int)uVar26 < (int)cVar3)) {
                              __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                            ,0x13f,
                                            "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                           );
                            }
                            uVar21 = (uint)(0xffffff < uVar35 && uVar26 == (int)cVar3);
                            *(uint *)&pC->field_0x1c = uVar35 & 0xffffbfff | uVar21 << 0xe;
                            p->nCutsUselessAll = p->nCutsUselessAll + uVar21;
                            p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                                 p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                                 (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                            p->nCutsCountAll = p->nCutsCountAll + 1;
                            p->nCutsCount[(byte)pC->field_0x1f] =
                                 p->nCutsCount[(byte)pC->field_0x1f] + 1;
                          }
                        }
                        else {
                          if (0x4ffffff < uVar21) {
                            __assert_fail("pCut->nLeaves <= 4",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                          ,0x118,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          if ((uVar21 & 0x7000000) == 0x4000000) {
                            uVar21 = pC->iCutFunc;
                            if ((int)uVar21 < 0) goto LAB_0039aff4;
                            pwVar37 = p->puTempW;
                            pVVar7 = p->vTtMem[4];
                            if (pVVar7 == (Vec_Mem_t *)0x0) {
                              pwVar28 = (word *)0x0;
                            }
                            else {
                              uVar35 = uVar21 >> 1;
                              if (pVVar7->nEntries <= (int)uVar35) goto LAB_0039afd5;
                              pwVar28 = pVVar7->ppPages[uVar35 >> ((byte)pVVar7->LogPageSze & 0x1f)]
                                        + (ulong)(uVar35 & pVVar7->PageMask) *
                                          (long)pVVar7->nEntrySize;
                            }
                            uVar35 = p->nTruth6Words[4];
                            if ((uVar21 & 1) == 0) {
                              if (0 < (int)uVar35) {
                                uVar38 = 0;
                                do {
                                  pwVar37[uVar38] = pwVar28[uVar38];
                                  uVar38 = uVar38 + 1;
                                } while (uVar35 != uVar38);
                              }
                            }
                            else if (0 < (int)uVar35) {
                              uVar38 = 0;
                              do {
                                pwVar37[uVar38] = ~pwVar28[uVar38];
                                uVar38 = uVar38 + 1;
                              } while (uVar35 != uVar38);
                            }
                            uVar21 = (uint)*pwVar37;
                            uVar35 = uVar21 & 0xffff;
                            pIVar43 = (If_Man_t *)(ulong)uVar35;
                            if (((((uVar35 & uVar35 - 1) == 0) || ((uVar21 & 0xffff) == 0x6996)) ||
                                ((uVar21 & 0xffff) == 0x9669)) ||
                               (uVar26 = uVar35 ^ 0xffff, (uVar26 & 0xfffe - uVar35) == 0))
                            goto LAB_0039a22e;
                            uVar21 = (uVar21 >> 1 & 0x5555) + (uVar21 & 0x5555);
                            uVar21 = (uVar21 >> 2 & 0x3333) + (uVar21 & 0x3333);
                            uVar21 = (uVar21 >> 4 & 0x707) + (uVar21 & 0x707);
                            iVar14 = (uVar21 >> 8) + (uVar21 & 0xff);
                            if (iVar14 == 9) {
                              pIVar43 = (If_Man_t *)(ulong)uVar26;
                              iVar14 = Abc_Tt4CheckTwoLevel(uVar26);
joined_r0x0039a410:
                              if (0 < iVar14) goto LAB_0039a22e;
                            }
                            else if (iVar14 == 7) {
                              iVar14 = Abc_Tt4CheckTwoLevel(uVar35);
                              goto joined_r0x0039a410;
                            }
                            pC->field_0x1d = pC->field_0x1d | 0x40;
                          }
                        }
                      }
                      else {
                        uVar35 = pC->iCutFunc;
                        if ((int)uVar35 < 0) goto LAB_0039afb6;
                        uVar21 = p->vTtDsds[uVar21 >> 0x18]->pArray[uVar35 >> 1];
                        if ((int)uVar21 < 0) goto LAB_0039af97;
                        pIVar43 = (If_Man_t *)p->pIfDsdMan;
                        uVar21 = If_DsdManReadMark((If_DsdMan_t *)pIVar43,uVar21 ^ uVar35 & 1);
                        *(uint *)&pC->field_0x1c =
                             *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar21 & 1) << 0xe;
                        p->nCutsUselessAll = p->nCutsUselessAll + (uVar21 & 1);
                        p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                             p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                             (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                        p->nCutsCountAll = p->nCutsCountAll + 1;
                        p->nCutsCount[(byte)pC->field_0x1f] =
                             p->nCutsCount[(byte)pC->field_0x1f] + 1;
                      }
                    }
                    else {
                      if (pIVar5->fUseTtPerm != 0) {
                        __assert_fail("p->pPars->fUseTtPerm == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0xec,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      if (0xc < (uVar21 >> 0x10 & 0xff) - 4) {
                        __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0xed,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      if (pIVar5->fUseDsd == 0) {
                        uVar35 = pC->iCutFunc;
                        if ((int)uVar35 < 0) goto LAB_0039aff4;
                        pwVar37 = p->puTempW;
                        pVVar7 = p->vTtMem[uVar21 >> 0x18];
                        if (pVVar7 == (Vec_Mem_t *)0x0) {
                          pwVar28 = (word *)0x0;
                        }
                        else {
                          uVar26 = uVar35 >> 1;
                          if (pVVar7->nEntries <= (int)uVar26) goto LAB_0039afd5;
                          pwVar28 = pVVar7->ppPages[uVar26 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                    (ulong)(uVar26 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
                        }
                        uVar21 = p->nTruth6Words[uVar21 >> 0x18];
                        if ((uVar35 & 1) == 0) {
                          if (0 < (int)uVar21) {
                            uVar38 = 0;
                            do {
                              pwVar37[uVar38] = pwVar28[uVar38];
                              uVar38 = uVar38 + 1;
                            } while (uVar21 != uVar38);
                          }
                        }
                        else if (0 < (int)uVar21) {
                          uVar38 = 0;
                          do {
                            pwVar37[uVar38] = ~pwVar28[uVar38];
                            uVar38 = uVar38 + 1;
                          } while (uVar21 != uVar38);
                        }
                        uVar35 = *(uint *)&pC->field_0x1c >> 0x18;
                        uVar21 = 6;
                        if (6 < uVar35) {
                          uVar21 = uVar35;
                        }
                        pIVar43 = p;
                        iVar14 = (*p_Var8)(p,(uint *)pwVar37,uVar21,uVar35,pIVar5->pLutStruct);
                        uVar21 = (uint)(iVar14 == 0);
                      }
                      else {
                        uVar35 = pC->iCutFunc;
                        if ((int)uVar35 < 0) {
LAB_0039afb6:
                          __assert_fail("pCut->iCutFunc >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                                        ,0x1a6,"int If_CutTruthLit(If_Cut_t *)");
                        }
                        uVar21 = p->vTtDsds[uVar21 >> 0x18]->pArray[uVar35 >> 1];
                        if ((int)uVar21 < 0) {
LAB_0039af97:
                          __assert_fail("Lit >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                        ,0x10f,"int Abc_LitNotCond(int, int)");
                        }
                        pIVar43 = (If_Man_t *)p->pIfDsdMan;
                        uVar21 = If_DsdManCheckDec((If_DsdMan_t *)pIVar43,uVar21 ^ uVar35 & 1);
                        uVar21 = uVar21 & 1;
                      }
                      *(uint *)&pC->field_0x1c =
                           *(uint *)&pC->field_0x1c & 0xffffbfff | uVar21 << 0xe;
                      p->nCutsUselessAll = p->nCutsUselessAll + uVar21;
                      p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                           p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                           (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                      p->nCutsCountAll = p->nCutsCountAll + 1;
                      p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                      pIVar5 = p->pPars;
                      if (((pIVar5->fEnableCheck75 == 0) && (pIVar5->fEnableCheck75u == 0)) ||
                         (*(short *)&pC->field_0x1e != 0x505)) {
                        if ((pIVar5->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                          uVar21 = pC->iCutFunc;
                          if ((int)uVar21 < 0) goto LAB_0039aff4;
                          pwVar37 = p->puTempW;
                          pVVar7 = p->vTtMem[5];
                          if (pVVar7 == (Vec_Mem_t *)0x0) {
                            pwVar28 = (word *)0x0;
                          }
                          else {
                            uVar35 = uVar21 >> 1;
                            if (pVVar7->nEntries <= (int)uVar35) goto LAB_0039afd5;
                            pwVar28 = pVVar7->ppPages[uVar35 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                      (ulong)(uVar35 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
                          }
                          uVar35 = p->nTruth6Words[5];
                          if ((uVar21 & 1) == 0) {
                            if (0 < (int)uVar35) {
                              uVar38 = 0;
                              do {
                                pwVar37[uVar38] = pwVar28[uVar38];
                                uVar38 = uVar38 + 1;
                              } while (uVar35 != uVar38);
                            }
                          }
                          else if (0 < (int)uVar35) {
                            uVar38 = 0;
                            do {
                              pwVar37[uVar38] = ~pwVar28[uVar38];
                              uVar38 = uVar38 + 1;
                            } while (uVar35 != uVar38);
                          }
                          pIVar43 = (If_Man_t *)CONCAT44((int)*pwVar37,(int)*pwVar37);
                          p->nCuts5 = p->nCuts5 + 1;
                          pIVar44 = pIVar43;
                          iVar14 = If_CluCheckDecInAny((word)pIVar43,5);
                          if ((iVar14 != 0) ||
                             (iVar14 = If_CluCheckDecOut((word)pIVar43,5), pIVar44 = pIVar43,
                             iVar14 != 0)) {
                            pIVar43 = pIVar44;
                            p->nCuts5a = p->nCuts5a + 1;
                          }
                        }
                      }
                      else {
                        uVar21 = pC->iCutFunc;
                        if ((int)uVar21 < 0) {
LAB_0039aff4:
                          __assert_fail("pCut->iCutFunc >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                                        ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
                        }
                        pwVar37 = p->puTempW;
                        pVVar7 = p->vTtMem[5];
                        if (pVVar7 == (Vec_Mem_t *)0x0) {
                          pwVar28 = (word *)0x0;
                        }
                        else {
                          uVar35 = uVar21 >> 1;
                          if (pVVar7->nEntries <= (int)uVar35) {
LAB_0039afd5:
                            __assert_fail("i >= 0 && i < p->nEntries",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                                          ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                          }
                          pwVar28 = pVVar7->ppPages[uVar35 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                                    (ulong)(uVar35 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
                        }
                        uVar35 = p->nTruth6Words[5];
                        if ((uVar21 & 1) == 0) {
                          if (0 < (int)uVar35) {
                            uVar38 = 0;
                            do {
                              pwVar37[uVar38] = pwVar28[uVar38];
                              uVar38 = uVar38 + 1;
                            } while (uVar35 != uVar38);
                          }
                        }
                        else if (0 < (int)uVar35) {
                          uVar38 = 0;
                          do {
                            pwVar37[uVar38] = ~pwVar28[uVar38];
                            uVar38 = uVar38 + 1;
                          } while (uVar35 != uVar38);
                        }
                        pIVar43 = (If_Man_t *)CONCAT44((int)*pwVar37,(int)*pwVar37);
                        p->nCuts5 = p->nCuts5 + 1;
                        iVar14 = If_CluCheckDecInAny((word)pIVar43,5);
                        if (iVar14 == 0) {
                          iVar15 = 7;
                          goto LAB_0039a230;
                        }
                        p->nCuts5a = p->nCuts5a + 1;
                      }
                    }
LAB_0039a22e:
                    iVar15 = 0;
                  }
LAB_0039a230:
                  if (iVar15 != 0) goto LAB_0039a4fe;
                }
                *(uint *)&pC->field_0x1c =
                     *(uint *)&pC->field_0x1c & 0xffffdfff |
                     (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) <<
                     0xd;
                p_Var9 = p->pPars->pFuncCost;
                if (p_Var9 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
                  uVar21 = 0;
                }
                else {
                  pIVar43 = p;
                  uVar21 = (*p_Var9)(p,pC);
                  uVar21 = uVar21 & 0xfff;
                }
                *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xfffff000 | uVar21;
                if (uVar21 != 0xfff) {
                  pIVar5 = p->pPars;
                  if (pIVar5->fDelayOpt == 0) {
                    if (pIVar5->fDsdBalance != 0) {
                      pIVar43 = p;
                      iVar14 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                      goto LAB_0039a434;
                    }
                    if (pIVar5->fUserRecLib != 0) {
                      pIVar43 = p;
                      iVar14 = If_CutDelayRecCost3(p,pC,pObj);
                      goto LAB_0039a434;
                    }
                    if (pIVar5->fDelayOptLut != 0) {
                      pIVar43 = p;
                      iVar14 = If_CutLutBalanceEval(p,pC);
                      goto LAB_0039a434;
                    }
                    if (0 < pIVar5->nGateSize) {
                      pIVar43 = p;
                      iVar14 = If_CutDelaySop(p,pC);
                      goto LAB_0039a434;
                    }
                    pIVar43 = p;
                    fVar52 = If_CutDelay(p,pObj,pC);
                  }
                  else {
                    pIVar43 = p;
                    iVar14 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_0039a434:
                    fVar52 = (float)iVar14;
                  }
                  pC->Delay = fVar52;
                  if (((fVar52 != -1.0) || (NAN(fVar52))) &&
                     ((Mode == 0 || (fVar52 <= pObj->Required + p->fEpsilon)))) {
                    if (Mode == 2) {
                      fVar52 = If_CutAreaDerefed(p,pC);
                    }
                    else {
                      fVar52 = If_CutAreaFlow(p,pC);
                    }
                    pC->Area = fVar52;
                    if (p->pPars->fEdge != 0) {
                      if (Mode == 2) {
                        fVar52 = If_CutEdgeDerefed(p,pC);
                      }
                      else {
                        fVar52 = If_CutEdgeFlow(p,pC);
                      }
                      pC->Edge = fVar52;
                    }
                    if (p->pPars->fPower != 0) {
                      if (Mode == 2) {
                        fVar52 = If_CutPowerDerefed(p,pC,pObj);
                      }
                      else {
                        fVar52 = If_CutPowerFlow(p,pC,pObj);
                      }
                      pC->Power = fVar52;
                    }
                    pIVar43 = p;
                    If_CutSort(p,(If_Set_t *)pCutSet,pC);
                  }
                }
              }
            }
          }
LAB_0039a4fe:
          lVar29 = lVar29 + 1;
          pIVar18 = pObj->pFanin1->pCutSet;
        } while (lVar29 < pIVar18->nCuts);
      }
      iVar14 = (int)pIVar43;
      lVar30 = lVar30 + 1;
      pIVar18 = pObj->pFanin0->pCutSet;
    } while (lVar30 < pIVar18->nCuts);
  }
  if (*(short *)((long)&pCutSet->pName + 2) < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x176,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((fPreprocess == 0) ||
     (*(float *)(*(long *)pCutSet->pConst1 + 0xc) <= pObj->Required + p->fEpsilon)) {
    pIVar45 = pCut;
    memcpy(pCut,*(void **)pCutSet->pConst1,(long)p->nCutBytes);
    iVar14 = (int)pIVar45;
    if ((p->pPars->fUserRecLib != 0) &&
       (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
        (pfVar1 = &(pObj->CutBest).Delay, 1e+09 < *pfVar1 || *pfVar1 == 1e+09)))) {
      __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                    ,0x17e,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
    pIVar6 = pCutSet->pConst1;
    sVar4 = *(short *)((long)&pCutSet->pName + 2);
    *(short *)((long)&pCutSet->pName + 2) = sVar4 + 1;
    pIVar43 = p;
    If_ManSetupCutTriv(p,*(If_Cut_t **)(&pIVar6->field_0x0 + (long)sVar4 * 8),pObj->Id);
    iVar14 = (int)pIVar43;
    if (*(short *)&pCutSet->pName + 1 < (int)*(short *)((long)&pCutSet->pName + 2)) {
      __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                    ,0x184,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    pIVar43 = p;
    If_CutAreaRef(p,pCut);
    iVar14 = (int)pIVar43;
  }
  if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
    Abc_Print(iVar14,"The best cut is useless.\n");
  }
  if ((p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) &&
     (pIVar18 = pObj->pCutSet, 0 < pIVar18->nCuts)) {
    lVar30 = 0;
    do {
      if (pIVar18->ppCuts[lVar30] == (If_Cut_t *)0x0) break;
      (*p->pPars->pFuncUser)(p,pObj,pIVar18->ppCuts[lVar30]);
      lVar30 = lVar30 + 1;
      pIVar18 = pObj->pCutSet;
    } while (lVar30 < pIVar18->nCuts);
  }
  If_ManDerefNodeCutSet(p,pObj);
  return;
LAB_0039abb3:
  uVar40 = 1;
LAB_0039abc1:
  if (uVar35 < 0x7000000) {
    uVar41 = 1 << (bVar20 & 0x1f);
    pIVar43 = (If_Man_t *)(ulong)uVar41;
    uVar41 = (uint)((s_Truths6Neg[uVar39] &
                    ((ulong)local_438[0] >> ((byte)uVar41 & 0x3f) ^ (ulong)local_438[0])) != 0);
  }
  else {
    uVar41 = 0;
    if (uVar39 < 6) {
      if (iVar15 != 0x1f) {
        uVar42 = 1 << (bVar20 & 0x1f);
        pIVar43 = (If_Man_t *)(ulong)uVar42;
        uVar50 = 0;
        do {
          if ((((ulong)local_438[uVar50] >> ((byte)uVar42 & 0x3f) ^ (ulong)local_438[uVar50]) &
              s_Truths6Neg[uVar39]) != 0) goto LAB_0039ac8e;
          uVar50 = uVar50 + 1;
          uVar41 = 0;
        } while (uVar46 != uVar50);
      }
    }
    else if (iVar15 != 0x1f) {
      pIVar43 = (If_Man_t *)(ulong)(uint)(1 << (bVar20 - 6 & 0x1f));
      uVar42 = 2 << (bVar20 - 6 & 0x1f);
      ppIVar24 = local_438 + (long)pIVar43;
      ppIVar32 = local_438;
      do {
        pIVar44 = (If_Man_t *)0x0;
        do {
          if (ppIVar32[(long)pIVar44] != ppIVar24[(long)pIVar44]) goto LAB_0039ac8e;
          pIVar44 = (If_Man_t *)((long)&pIVar44->pName + 1);
        } while (pIVar43 != pIVar44);
        ppIVar32 = ppIVar32 + uVar42;
        ppIVar24 = ppIVar24 + uVar42;
        uVar41 = 0;
      } while (ppIVar32 < local_438 + (int)uVar34);
    }
  }
LAB_0039aca4:
  iVar16 = uVar40 + iVar16;
  uVar50 = uVar39;
  if ((iVar22 < iVar16) || (iVar51 = iVar51 + uVar41, iVar22 < iVar51)) goto LAB_0039acce;
LAB_0039acbc:
  uVar39 = uVar39 + 1;
  uVar50 = uVar38;
  if (uVar39 == uVar38) goto LAB_0039acce;
  goto LAB_0039aad7;
LAB_0039ac8e:
  uVar41 = 1;
  goto LAB_0039aca4;
LAB_0039acce:
  if ((int)uVar50 == iVar14) {
    uVar47 = uVar25 & 0xffffffff;
    goto LAB_0039ad00;
  }
  uVar25 = uVar25 + 1;
  if (uVar25 == uVar38) goto LAB_0039ad00;
  goto LAB_0039a8b6;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct != NULL;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
        {
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDsdBalance )
        {
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fUserRecLib )
        {
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if(p->pPars->fUserRecLib)
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}